

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# areadump.cc
# Opt level: O3

int main(int argc,char **argv)

{
  _Base_ptr *b;
  _Base_ptr *m;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_color _Var3;
  _Base_ptr p_Var4;
  long lVar5;
  int iVar6;
  string *psVar7;
  int iVar8;
  mapped_type *this;
  ulong uVar9;
  ostream *poVar10;
  _Rb_tree_node_base *p_Var11;
  undefined8 extraout_RAX;
  uint uVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  uint uVar15;
  uint uVar16;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  uint uVar20;
  __normal_iterator<lrit::File_*,_std::vector<lrit::File,_std::allocator<lrit::File>_>_> __i;
  string *file;
  int iVar21;
  int iVar22;
  ImageStructureHeader IVar23;
  SegmentIdentificationHeader sih;
  Dir dir;
  map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  all;
  stat st;
  string local_210;
  _Base_ptr local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  _Rb_tree_node_base *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  File local_188;
  _Rb_tree<int,_std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  local_f0;
  stat local_c0;
  ulong uVar17;
  
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (1 < argc) {
    paVar1 = &local_188.file_.field_2;
    p_Var2 = &local_188.m_._M_t._M_impl.super__Rb_tree_header;
    local_1f0 = (_Base_ptr)(ulong)(uint)argc;
    p_Var13 = (_Base_ptr)0x1;
    do {
      iVar8 = stat(argv[(long)p_Var13],&local_c0);
      if (iVar8 < 0) {
        main_cold_1();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1e8);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
        ::~_Rb_tree(&local_f0);
        _Unwind_Resume(extraout_RAX);
      }
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((local_c0.st_mode & 0xf000) == 0x4000) {
        std::__cxx11::string::string
                  ((string *)&local_210,argv[(long)p_Var13],(allocator *)&local_1c8);
        Dir::Dir((Dir *)&local_188,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"*.lrit*","");
        Dir::matchFiles(&local_1a8,(Dir *)&local_188,&local_210);
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
        local_1a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
        local_1a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        Dir::~Dir((Dir *)&local_188);
        file = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_188,argv[(long)p_Var13],(allocator *)&local_210);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1e8,
                   &local_188.file_);
        file = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar7 = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.file_._M_dataplus._M_p != paVar1) {
          operator_delete(local_188.file_._M_dataplus._M_p,
                          local_188.file_.field_2._M_allocated_capacity + 1);
          file = local_1e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          psVar7 = local_1e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      for (; file != psVar7; file = file + 1) {
        lrit::File::File(&local_188,file);
        p_Var4 = local_188.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var19 = &p_Var2->_M_header;
        if (local_188.m_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          do {
            p_Var18 = p_Var19;
            p_Var14 = p_Var4;
            _Var3 = p_Var14[1]._M_color;
            p_Var19 = p_Var14;
            if ((int)_Var3 < 2) {
              p_Var19 = p_Var18;
            }
            p_Var4 = (&p_Var14->_M_left)[(int)_Var3 < 2];
          } while ((&p_Var14->_M_left)[(int)_Var3 < 2] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var19 != p_Var2) {
            if ((int)_Var3 < 2) {
              p_Var14 = p_Var18;
            }
            if ((int)p_Var14[1]._M_color < 3) {
              lrit::getHeader<lrit::SegmentIdentificationHeader>
                        ((SegmentIdentificationHeader *)&local_210,&local_188.header_,&local_188.m_)
              ;
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_1c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint)local_210._M_dataplus._M_p._4_2_);
              this = std::
                     map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
                     ::operator[]((map<int,_std::vector<lrit::File,_std::allocator<lrit::File>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
                                   *)&local_f0,(key_type *)&local_1c8);
              std::vector<lrit::File,_std::allocator<lrit::File>_>::emplace_back<lrit::File>
                        (this,&local_188);
            }
          }
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_188.m_._M_t);
        if (local_188.header_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.header_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_188.header_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188.header_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_188.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          CONCAT44(local_188.buf_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   (int)local_188.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage) -
                          (long)local_188.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.file_._M_dataplus._M_p != paVar1) {
          operator_delete(local_188.file_._M_dataplus._M_p,
                          local_188.file_.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1e8);
      p_Var13 = (_Base_ptr)((long)&p_Var13->_M_color + 1);
      p_Var11 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (p_Var13 != local_1f0);
    for (; (_Rb_tree_header *)p_Var11 != &local_f0._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      p_Var13 = p_Var11[1]._M_parent;
      p_Var4 = p_Var11[1]._M_left;
      local_1d0 = p_Var11;
      if (p_Var13 != p_Var4) {
        uVar9 = ((long)p_Var4 - (long)p_Var13 >> 3) * -0x79435e50d79435e5;
        lVar5 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                  (p_Var13,p_Var4,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)p_Var4 - (long)p_Var13 < 0x981) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                    (p_Var13,p_Var4);
        }
        else {
          p_Var19 = p_Var13 + 0x4c;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,__gnu_cxx::__ops::_Iter_comp_iter<main::__0>>
                    (p_Var13,p_Var19);
          for (; p_Var19 != p_Var4; p_Var19 = (_Base_ptr)&p_Var19[4]._M_right) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<lrit::File*,std::vector<lrit::File,std::allocator<lrit::File>>>,__gnu_cxx::__ops::_Val_comp_iter<main::__0>>
                      (p_Var19);
          }
        }
      }
      p_Var11 = local_1d0;
      lrit::getHeader<lrit::SegmentIdentificationHeader>
                ((SegmentIdentificationHeader *)&local_c0,
                 (Buffer *)&local_1d0[1]._M_parent[1]._M_right,
                 (HeaderMap *)&local_1d0[1]._M_parent[2]._M_left);
      p_Var13 = p_Var11[1]._M_parent;
      p_Var4 = p_Var11[1]._M_left;
      if (((long)p_Var4 - (long)p_Var13 >> 3) * -0x79435e50d79435e5 - (ulong)local_c0.st_ino._4_2_
          == 0) {
        if (p_Var13 == p_Var4) {
          iVar8 = 0;
          iVar21 = 0;
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          iVar21 = 0;
          local_1f0 = p_Var4;
          iVar6 = 0;
          do {
            b = &p_Var13[1]._M_right;
            m = &p_Var13[2]._M_left;
            IVar23 = lrit::getHeader<lrit::ImageStructureHeader>((Buffer *)b,(HeaderMap *)m);
            lrit::getHeader<lrit::ImageNavigationHeader>
                      ((ImageNavigationHeader *)&local_188,(Buffer *)b,(HeaderMap *)m);
            lrit::getHeader<lrit::NOAALRITHeader>((Buffer *)b,(HeaderMap *)m);
            iVar22 = (uint)IVar23.columns -
                     (int)local_188.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            iVar8 = -(int)local_188.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            uVar16 = (IVar23._8_4_ & 0xffff) -
                     local_188.buf_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
            uVar17 = (ulong)uVar16;
            uVar15 = -local_188.buf_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
            uVar12 = (uint)(uVar9 >> 0x20);
            uVar20 = (uint)uVar9;
            if (uVar12 != uVar20) {
              if (iVar8 < iVar6) {
                iVar6 = iVar8;
              }
              iVar8 = iVar6;
              if (iVar22 < iVar21) {
                iVar22 = iVar21;
              }
              if ((int)uVar15 < (int)uVar20) {
                uVar20 = uVar15;
              }
              uVar15 = uVar20;
              if ((int)uVar16 < (int)uVar12) {
                uVar17 = uVar9 >> 0x20;
              }
            }
            iVar21 = iVar22;
            if ((undefined1 *)local_188.file_._M_string_length !=
                (undefined1 *)((long)&local_188.file_.field_2 + 8)) {
              operator_delete((void *)local_188.file_._M_string_length,
                              local_188.file_.field_2._8_8_ + 1);
            }
            uVar9 = uVar17 << 0x20 | (ulong)uVar15;
            p_Var13 = (_Base_ptr)&p_Var13[4]._M_right;
            iVar6 = iVar8;
          } while (p_Var13 != local_1f0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"crop = [ ",9);
        p_Var11 = local_1d0;
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar21);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)(uVar9 >> 0x20));
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," ]",2);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
        std::ostream::put('8');
        std::ostream::flush();
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<lrit::File,_std::allocator<lrit::File>_>_>_>_>
  ::~_Rb_tree(&local_f0);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  std::map<int, std::vector<lrit::File>> all;

  // Group files by their image identifier
  for (int i = 1; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      perror("stat");
      exit(1);
    }

    std::vector<std::string> result;
    if (S_ISDIR(st.st_mode)) {
      Dir dir(argv[i]);
      result = dir.matchFiles("*.lrit*");
    } else {
      result.push_back(argv[i]);
    }

    for (const auto& path : result) {
      auto file = lrit::File(path);
      if (!file.hasHeader<lrit::ImageNavigationHeader>()) {
        continue;
      }

      auto sih = file.getHeader<lrit::SegmentIdentificationHeader>();
      auto& files = all[sih.imageIdentifier];
      files.push_back(std::move(file));
    }
  }

  // Compute area for all images
  for (auto& it : all) {
    auto& files = it.second;

    // Sort by segment identifier
    std::sort(
      files.begin(),
      files.end(),
      [](const auto& a, const auto& b) -> bool {
        auto sa = a.template getHeader<lrit::SegmentIdentificationHeader>();
        auto sb = b.template getHeader<lrit::SegmentIdentificationHeader>();
        return sa.segmentNumber < sb.segmentNumber;
      });

    // Ignore incomplete images
    auto si = files[0].getHeader<lrit::SegmentIdentificationHeader>();
    if (files.size() != si.maxSegment) {
      continue;
    }

    // Compute area covered by this segmented image.
    // Largely copied from the original version of goesproc,
    // which was removed in eaa56cb2.
    Area area;
    for (auto& file : files) {
      auto is = file.getHeader<lrit::ImageStructureHeader>();
      auto in = file.getHeader<lrit::ImageNavigationHeader>();
      auto nl = file.getHeader<lrit::NOAALRITHeader>();

      // Update relative area represented by this image
      Area tmp;
      tmp.minColumn = -in.columnOffset;
      tmp.maxColumn = -in.columnOffset + is.columns;
      tmp.minLine = -in.lineOffset;
      tmp.maxLine = -in.lineOffset + is.lines;

      // For Himawari-8, the line offset is an int32_t and can be negative
      if (nl.productID == 43) {
        tmp.minLine = -(int32_t)in.lineOffset;
        tmp.maxLine = -(int32_t)in.lineOffset + is.lines;
      }

      if (area.height() == 0) {
        area = tmp;
      } else {
        area = area.getUnion(tmp);
      }
    }

    std::cout << "crop = [ ";
    std::cout << area.minColumn << ", ";
    std::cout << area.maxColumn << ", ";
    std::cout << area.minLine << ", ";
    std::cout << area.maxLine << " ]";
    std::cout << std::endl;
  }
}